

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O1

int tnt_iter_array_next(tnt_iter *i)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char **data;
  long k;
  
  uVar5 = (i->data).array.cur_index + 1;
  (i->data).array.cur_index = uVar5;
  if (uVar5 < (i->data).array.elem_count) {
    pcVar2 = *(char **)((long)&i->data + (ulong)(uVar5 != 0) * 0x10 + 8);
    (i->data).array.elem = pcVar2;
    (i->data).array.elem_end = pcVar2;
    data = &(i->data).array.elem_end;
    k = 1;
    do {
      pbVar3 = (byte *)*data;
      bVar1 = *pbVar3;
      *data = (char *)(pbVar3 + 1);
      lVar7 = (long)""[bVar1];
      if (lVar7 < 0) {
        if (bVar1 == 0xd9) {
          *data = (char *)(pbVar3 + (ulong)pbVar3[1] + 2);
          goto LAB_0010aec8;
        }
        if (-0x20 < ""[bVar1]) {
          k = k - lVar7;
          goto LAB_0010aec8;
        }
        *data = (char *)pbVar3;
        mp_next_slowpath(data,k);
        bVar4 = false;
        lVar7 = k;
      }
      else {
        *data = (char *)(pbVar3 + 1 + lVar7);
LAB_0010aec8:
        bVar4 = true;
        lVar7 = k;
      }
      iVar6 = 1;
    } while ((bVar4) && (k = lVar7 + -1, 1 < lVar7));
  }
  else {
    i->status = TNT_ITER_FAIL;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int tnt_iter_array_next(struct tnt_iter *i) {
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->elem_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->elem = itr->first_elem;
	else
		itr->elem = itr->elem_end;
	itr->elem_end = itr->elem;
	mp_next(&itr->elem_end);
	return 1;
}